

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void slang::ast::SFormat::formatRaw4(string *result,ConstantValue *value)

{
  bool bVar1;
  bitwidth_t bVar2;
  SVInt *this;
  uint64_t *puVar3;
  string *in_RSI;
  uint64_t unknowns;
  uint64_t bits;
  uint32_t i;
  anon_class_8_1_6971b95b writeEntry;
  uint32_t lastBits;
  uint64_t *unknownPtr;
  uint64_t *ptr;
  uint32_t words;
  SVInt *sv;
  ConstantValue *elem;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ConstantValue,_18446744073709551615UL> *__range3;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  SVInt *in_stack_ffffffffffffff70;
  anon_class_8_1_6971b95b *this_00;
  span<const_slang::ConstantValue,_18446744073709551615UL> *in_stack_ffffffffffffff78;
  uint local_74;
  uint local_64;
  uint64_t *local_60;
  uint local_4c;
  __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
  local_30;
  span<const_slang::ConstantValue,_18446744073709551615UL> local_28;
  span<const_slang::ConstantValue,_18446744073709551615UL> *value_00;
  
  bVar1 = slang::ConstantValue::isUnpacked((ConstantValue *)0x91f994);
  if (bVar1) {
    local_28 = slang::ConstantValue::elements((ConstantValue *)0x91f9aa);
    value_00 = &local_28;
    local_30._M_current =
         (ConstantValue *)
         std::span<const_slang::ConstantValue,_18446744073709551615UL>::begin
                   ((span<const_slang::ConstantValue,_18446744073709551615UL> *)
                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    std::span<const_slang::ConstantValue,_18446744073709551615UL>::end(in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff70,
                              (__normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
                               *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
      ::operator*(&local_30);
      formatRaw4(in_RSI,(ConstantValue *)value_00);
      __gnu_cxx::
      __normal_iterator<const_slang::ConstantValue_*,_std::span<const_slang::ConstantValue,_18446744073709551615UL>_>
      ::operator++(&local_30);
    }
  }
  else {
    this = slang::ConstantValue::integer((ConstantValue *)0x91fa3b);
    local_4c = SVInt::getNumWords((SVInt *)0x91fa4a);
    puVar3 = SVInt::getRawPtr(in_stack_ffffffffffffff70);
    local_60 = (uint64_t *)0x0;
    bVar1 = SVInt::hasUnknown(this);
    if (bVar1) {
      local_4c = local_4c >> 1;
      local_60 = puVar3 + local_4c;
    }
    bVar2 = SVInt::getBitWidth(this);
    local_64 = bVar2 & 0x3f;
    if (local_64 == 0) {
      local_64 = 0x40;
    }
    for (local_74 = 0; local_74 < local_4c; local_74 = local_74 + 1) {
      if (local_60 == (uint64_t *)0x0) {
        this_00 = (anon_class_8_1_6971b95b *)0x0;
      }
      else {
        this_00 = (anon_class_8_1_6971b95b *)local_60[local_74];
      }
      formatRaw4::anon_class_8_1_6971b95b::operator()
                (this_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      if ((local_74 != local_4c - 1) || (0x20 < local_64)) {
        formatRaw4::anon_class_8_1_6971b95b::operator()
                  (this_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      }
    }
  }
  return;
}

Assistant:

static void formatRaw4(std::string& result, const ConstantValue& value) {
    if (value.isUnpacked()) {
        for (auto& elem : value.elements())
            formatRaw4(result, elem);
        return;
    }

    const SVInt& sv = value.integer();
    uint32_t words = sv.getNumWords();
    const uint64_t* ptr = sv.getRawPtr();
    const uint64_t* unknownPtr = nullptr;
    if (sv.hasUnknown()) {
        words /= 2;
        unknownPtr = ptr + words;
    }

    uint32_t lastBits = sv.getBitWidth() % 64;
    if (lastBits == 0)
        lastBits = 64;

    auto writeEntry = [&result](uint32_t bits, uint32_t unknowns) {
        // The encoding for X and Z are reversed from how SVInt stores them.
        s_vpi_vecval entry;
        entry.aval = bits ^ unknowns;
        entry.bval = unknowns;
        result.append(reinterpret_cast<const char*>(&entry), sizeof(s_vpi_vecval));
    };

    for (uint32_t i = 0; i < words; i++) {
        uint64_t bits = ptr[i];
        uint64_t unknowns = unknownPtr ? unknownPtr[i] : 0;

        writeEntry(uint32_t(bits), uint32_t(unknowns));

        // Don't write the upper half of the last word if we don't actually have those bits.
        if (i != words - 1 || lastBits > 32)
            writeEntry(uint32_t(bits >> 32), uint32_t(unknowns >> 32));
    }
}